

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-quants.c
# Opt level: O0

void quantize_row_q8_K_ref(float *x,block_q8_K *y,int64_t k)

{
  short sVar1;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  float fVar2;
  int ii;
  int sum;
  int j_2;
  int v;
  int j_1;
  float iscale;
  float ax;
  int j;
  float amax;
  float max;
  int i;
  int64_t nb;
  int local_50;
  int local_4c;
  int local_44;
  int local_3c;
  int local_30;
  float local_2c;
  float local_28;
  int local_24;
  long local_8;
  
  local_8 = in_RDI;
  for (local_24 = 0; (long)local_24 < in_RDX / 0x100; local_24 = local_24 + 1) {
    local_28 = 0.0;
    local_2c = 0.0;
    for (local_30 = 0; local_30 < 0x100; local_30 = local_30 + 1) {
      fVar2 = ABS(*(float *)(local_8 + (long)local_30 * 4));
      if (local_2c < fVar2) {
        local_28 = *(float *)(local_8 + (long)local_30 * 4);
        local_2c = fVar2;
      }
    }
    if ((local_2c != 0.0) || (NAN(local_2c))) {
      for (local_3c = 0; local_3c < 0x100; local_3c = local_3c + 1) {
        local_50 = nearest_int((-127.0 / local_28) * *(float *)(local_8 + (long)local_3c * 4));
        if (0x7f < local_50) {
          local_50 = 0x7f;
        }
        *(char *)(in_RSI + (long)local_24 * 0x124 + 4 + (long)local_3c) = (char)local_50;
      }
      for (local_44 = 0; local_44 < 0x10; local_44 = local_44 + 1) {
        sVar1 = 0;
        for (local_4c = 0; local_4c < 0x10; local_4c = local_4c + 1) {
          sVar1 = *(char *)(in_RSI + (long)local_24 * 0x124 + 4 + (long)(local_44 * 0x10 + local_4c)
                           ) + sVar1;
        }
        *(short *)(in_RSI + (long)local_24 * 0x124 + 0x104 + (long)local_44 * 2) = sVar1;
      }
      *(float *)(in_RSI + (long)local_24 * 0x124) = 1.0 / (-127.0 / local_28);
    }
    else {
      *(undefined4 *)(in_RSI + (long)local_24 * 0x124) = 0;
      memset((void *)(in_RSI + (long)local_24 * 0x124 + 4),0,0x100);
    }
    local_8 = local_8 + 0x400;
  }
  return;
}

Assistant:

void quantize_row_q8_K_ref(const float * GGML_RESTRICT x, block_q8_K * GGML_RESTRICT y, int64_t k) {
    assert(k % QK_K == 0);
    const int64_t nb = k / QK_K;

    for (int i = 0; i < nb; i++) {

        float max = 0;
        float amax = 0;
        for (int j = 0; j < QK_K; ++j) {
            float ax = fabsf(x[j]);
            if (ax > amax) {
                amax = ax; max = x[j];
            }
        }
        if (!amax) {
            y[i].d = 0;
            memset(y[i].qs, 0, QK_K);
            x += QK_K;
            continue;
        }
        //const float iscale = -128.f/max;
        // We need this change for IQ2_XXS, else the AVX implementation becomes very awkward
        const float iscale = -127.f/max;
        for (int j = 0; j < QK_K; ++j) {
            int v = nearest_int(iscale*x[j]);
            y[i].qs[j] = MIN(127, v);
        }
        for (int j = 0; j < QK_K/16; ++j) {
            int sum = 0;
            for (int ii = 0; ii < 16; ++ii) {
                sum += y[i].qs[j*16 + ii];
            }
            y[i].bsums[j] = sum;
        }
        y[i].d = 1/iscale;
        x += QK_K;
    }
}